

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmetadata_p.h
# Opt level: O0

QDateTime __thiscall QFileSystemMetaData::fileTime(QFileSystemMetaData *this,FileTime time)

{
  undefined4 in_EDX;
  Data in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  switch(in_EDX) {
  case 0:
    accessTime((QFileSystemMetaData *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    break;
  case 1:
    birthTime((QFileSystemMetaData *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    break;
  case 2:
    metadataChangeTime((QFileSystemMetaData *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    break;
  case 3:
    modificationTime((QFileSystemMetaData *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    break;
  default:
    QDateTime::QDateTime((QDateTime *)0x19b10a);
  }
  return (QDateTime)in_RDI;
}

Assistant:

inline QDateTime QFileSystemMetaData::fileTime(QFile::FileTime time) const
{
    switch (time) {
    case QFile::FileModificationTime:
        return modificationTime();

    case QFile::FileAccessTime:
        return accessTime();

    case QFile::FileBirthTime:
        return birthTime();

    case QFile::FileMetadataChangeTime:
        return metadataChangeTime();
    }

    return QDateTime();
}